

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObject.cpp
# Opt level: O3

bool __thiscall SessionObject::deleteAttribute(SessionObject *this,CK_ATTRIBUTE_TYPE type)

{
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  mapped_type *ppOVar1;
  int lineNo;
  bool bVar2;
  char *format;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  pVar3;
  MutexLocker lock;
  CK_ATTRIBUTE_TYPE local_30;
  MutexLocker local_28;
  
  local_30 = type;
  MutexLocker::MutexLocker(&local_28,this->objectMutex);
  if (this->valid == false) {
    format = "Cannot update invalid session object 0x%08X";
    lineNo = 0xc9;
  }
  else {
    this_00 = &this->attributes;
    ppOVar1 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,&local_30);
    if (*ppOVar1 != (mapped_type)0x0) {
      ppOVar1 = std::
                map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                ::operator[](this_00,&local_30);
      if (*ppOVar1 != (mapped_type)0x0) {
        (*(*ppOVar1)->_vptr_OSAttribute[1])();
      }
      pVar3 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::equal_range(&this_00->_M_t,&local_30);
      bVar2 = true;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
      goto LAB_0016df7f;
    }
    format = "Cannot delete attribute that doesn\'t exist in object 0x%08X";
    lineNo = 0xd0;
  }
  bVar2 = false;
  softHSMLog(7,"deleteAttribute",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/SessionObject.cpp"
             ,lineNo,format,this);
LAB_0016df7f:
  MutexLocker::~MutexLocker(&local_28);
  return bVar2;
}

Assistant:

bool SessionObject::deleteAttribute(CK_ATTRIBUTE_TYPE type)
{
	MutexLocker lock(objectMutex);

	if (!valid)
	{
		DEBUG_MSG("Cannot update invalid session object 0x%08X", this);

		return false;
	}

	if (attributes[type] == NULL)
	{
		DEBUG_MSG("Cannot delete attribute that doesn't exist in object 0x%08X", this);

		return false;
	}

	delete attributes[type];
	attributes.erase(type);

	return true;
}